

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::SetPathDependentInfo(GlobOpt *this,bool conditionToBranch,PathDependentInfo *info)

{
  code *pcVar1;
  FlowEdge **this_00;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  uint functionId;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar5;
  undefined4 *puVar6;
  BasicBlock *pBVar7;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  Type_conflict node;
  Type *ppFVar8;
  Instr *pIVar9;
  FlowEdge **edge;
  Iterator __iter;
  Instr *fallthrough;
  PathDependentInfo *info_local;
  bool conditionToBranch_local;
  GlobOpt *this_local;
  
  pSVar5 = BasicBlock::GetSuccList(this->currentBlock);
  uVar3 = RealCount::Count(&(pSVar5->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>)
                            .super_RealCount);
  if (uVar3 != 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x28a6,"(this->currentBlock->GetSuccList()->Count() == 2)",
                       "this->currentBlock->GetSuccList()->Count() == 2");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pBVar7 = BasicBlock::GetNext(this->currentBlock);
  __iter.current = (NodeBase *)BasicBlock::GetFirstInstr(pBVar7);
  this_01 = &BasicBlock::GetSuccList(this->currentBlock)->
             super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  _edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(this_01);
  while( true ) {
    if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    this_00 = edge;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node);
    if (bVar2) break;
    SListNodeBase<Memory::ArenaAllocator>::Next
              (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&edge);
    pBVar7 = FlowEdge::GetSucc(*ppFVar8);
    pIVar9 = BasicBlock::GetFirstInstr(pBVar7);
    if (conditionToBranch == (pIVar9 != (Instr *)__iter.current)) {
      FlowEdge::SetPathDependentInfo(*ppFVar8,info,this->alloc);
      return;
    }
  }
  BVar4 = Func::HasTry(this->func);
  if (BVar4 != 0) {
    return;
  }
  uVar3 = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FGPeepsPhase,uVar3,functionId);
  if (bVar2) {
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,0x28b3,
                     "(this->func->HasTry() || Js::Configuration::Global.flags.Off.IsEnabled(((Js::FGPeepsPhase)), ((this->func)->GetSourceContextId()), ((this->func)->GetLocalFunctionId())))"
                     ,"this->func->HasTry() || PHASE_OFF(Js::FGPeepsPhase, this->func)");
  if (bVar2) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void
GlobOpt::SetPathDependentInfo(const bool conditionToBranch, const PathDependentInfo &info)
{
    Assert(this->currentBlock->GetSuccList()->Count() == 2);
    IR::Instr * fallthrough = this->currentBlock->GetNext()->GetFirstInstr();
    FOREACH_SLISTBASECOUNTED_ENTRY(FlowEdge*, edge, this->currentBlock->GetSuccList())
    {
        if (conditionToBranch == (edge->GetSucc()->GetFirstInstr() != fallthrough))
        {
            edge->SetPathDependentInfo(info, alloc);
            return;
        }
    }
    NEXT_SLISTBASECOUNTED_ENTRY;

    // In case flowgraph peeps is disabled, we could have conditional branch to next instr
    Assert(this->func->HasTry() || PHASE_OFF(Js::FGPeepsPhase, this->func));
}